

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

int64_t kratos::convert_string_to_int(string *value)

{
  bool bVar1;
  reference pcVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  long local_38;
  int64_t c;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  const_reverse_iterator it;
  int64_t idx;
  int64_t converted_value;
  string *value_local;
  
  idx = 0;
  it.current._M_current =
       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(char *)0x0;
  std::__cxx11::string::rbegin();
  while( true ) {
    std::__cxx11::string::rend();
    bVar1 = std::operator!=(&local_28,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&c);
    if (!bVar1) break;
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_28);
    local_38 = (long)*pcVar2;
    idx = local_38 << ((byte)it.current._M_current & 0x3f) | idx;
    it.current._M_current =
         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )((long)it.current._M_current + 8);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_40,(int)&local_28);
  }
  return idx;
}

Assistant:

int64_t convert_string_to_int(const std::string &value) {
    int64_t converted_value = 0;
    // SystemVerilog uses reverse order if it's [hi:lo] (kratos does that)
    int64_t idx = 0;
    for (auto it = value.rbegin(); it != value.rend(); it++) {
        auto c = static_cast<int64_t>(*it);  // NOLINT
        converted_value |= c << idx;
        idx += 8;
    }
    return converted_value;
}